

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction_widgets.cpp
# Opt level: O2

void __thiscall QtWidgetsActionPrivate::destroy(QtWidgetsActionPrivate *this)

{
  QAction *action;
  QObject **ppQVar1;
  QWidget *this_00;
  QGraphicsWidget *this_01;
  long lVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<QObject_*> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  action = *(QAction **)&this->field_0x8;
  local_38.d = *(Data **)&this->field_0x140;
  ppQVar1 = *(QObject ***)&this->field_0x148;
  local_38.size = *(qsizetype *)&this->field_0x150;
  if (local_38.d != (Data *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38.ptr = ppQVar1;
  for (lVar2 = local_38.size << 3; lVar2 != 0; lVar2 = lVar2 + -8) {
    this_00 = *(QWidget **)((long)ppQVar1 + lVar2 + -8);
    if ((this_00 == (QWidget *)0x0) || ((*(byte *)(*(long *)&this_00->field_0x8 + 0x30) & 1) == 0))
    {
      this_01 = QtPrivate::qobject_cast_helper<QGraphicsWidget*,QObject>(&this_00->super_QObject);
      if (this_01 != (QGraphicsWidget *)0x0) {
        QGraphicsWidget::removeAction((QGraphicsWidget *)this_01,action);
      }
    }
    else {
      QWidget::removeAction(this_00,action);
    }
  }
  QArrayDataPointer<QObject_*>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QtWidgetsActionPrivate::destroy()
{
    Q_Q(QAction);
    const auto objects = associatedObjects;
    const auto end = objects.crend();
    for (auto it = objects.crbegin(); it != end; ++it) {
        QObject *object = *it;
        if (QWidget *widget = qobject_cast<QWidget*>(object))
            widget->removeAction(q);
#if QT_CONFIG(graphicsview)
        else if (QGraphicsWidget *graphicsWidget = qobject_cast<QGraphicsWidget*>(object))
            graphicsWidget->removeAction(q);
#endif
    }
}